

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.cpp
# Opt level: O3

void __thiscall
amrex::FABio_ascii::write_header(FABio_ascii *this,ostream *os,FArrayBox *f,int nvar)

{
  ostream *poVar1;
  char local_2b [3];
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"FAB: ",5);
  poVar1 = (ostream *)std::ostream::operator<<(os,0);
  local_2b[0] = ' ';
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2b,1);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,0);
  local_2b[1] = 0x20;
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2b + 1,1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"IEEE",4);
  local_2b[2] = 10;
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2b + 2,1);
  FABio::write_header((FABio *)poVar1,os,f,nvar);
  return;
}

Assistant:

void
FABio_ascii::write_header (std::ostream&    os,
                           const FArrayBox& f,
                           int              nvar) const
{
    os << "FAB: "
       << FABio::FAB_ASCII
       << ' '
       << 0
       << ' '
       << sys_name
       << '\n';
    FABio::write_header(os, f, nvar);
}